

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

extent_hooks_t *
duckdb_je_arena_set_extent_hooks(tsd_t *tsd,arena_t *arena,extent_hooks_t *extent_hooks)

{
  uint uVar1;
  extent_hooks_t *peVar2;
  pa_shard_t *in_RDX;
  arena_t *in_RSI;
  extent_hooks_t *ret;
  background_thread_info_t *info;
  uint arena_ind;
  background_thread_info_t *extent_hooks_00;
  
  uVar1 = arena_ind_get(in_RSI);
  extent_hooks_00 =
       duckdb_je_background_thread_info + (ulong)uVar1 % duckdb_je_max_background_threads;
  malloc_mutex_lock((tsdn_t *)in_RSI,(malloc_mutex_t *)in_RDX);
  duckdb_je_pa_shard_disable_hpa((tsdn_t *)in_RSI,in_RDX);
  peVar2 = duckdb_je_base_extent_hooks_set((base_t *)in_RDX,(extent_hooks_t *)extent_hooks_00);
  malloc_mutex_unlock((tsdn_t *)in_RDX,(malloc_mutex_t *)extent_hooks_00);
  return peVar2;
}

Assistant:

extent_hooks_t *
arena_set_extent_hooks(tsd_t *tsd, arena_t *arena,
    extent_hooks_t *extent_hooks) {
	background_thread_info_t *info;
	if (have_background_thread) {
		info = arena_background_thread_info_get(arena);
		malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
	}
	/* No using the HPA now that we have the custom hooks. */
	pa_shard_disable_hpa(tsd_tsdn(tsd), &arena->pa_shard);
	extent_hooks_t *ret = base_extent_hooks_set(arena->base, extent_hooks);
	if (have_background_thread) {
		malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
	}

	return ret;
}